

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int SHA1_Final(SHA1_CTX *context,uint8_t *digest)

{
  void *pvVar1;
  uint8_t c;
  uint8_t finalcount [8];
  uint i;
  undefined1 local_1d;
  undefined1 local_1c [8];
  uint local_14;
  uint8_t *local_10;
  SHA_CTX *local_8;
  
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    local_1c[local_14] =
         (char)(context->count[(int)(uint)(local_14 < 4)] >>
               (('\x03' - ((byte)local_14 & 3)) * '\b' & 0x1f));
  }
  local_1d = 0x80;
  local_10 = digest;
  local_8 = (SHA_CTX *)context;
  SHA1_Update((SHA_CTX *)context,&local_1d,1);
  while ((local_8->Nl & 0x1f8) != 0x1c0) {
    local_1d = 0;
    SHA1_Update(local_8,&local_1d,1);
  }
  SHA1_Update(local_8,local_1c,8);
  for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
    local_10[local_14] =
         (uint8_t)(local_8->data[(ulong)(local_14 >> 2) - 7] >>
                  (('\x03' - ((byte)local_14 & 3)) * '\b' & 0x1f));
  }
  memset(local_8,0,0x5c);
  pvVar1 = memset(local_1c,0,8);
  return (int)pvVar1;
}

Assistant:

void SHA1_Final(SHA1_CTX *context, uint8_t digest[SHA1_DIGEST_SIZE]) {
  unsigned i;
  uint8_t finalcount[8];
  uint8_t c;

  for (i = 0; i < 8; i++) {
    finalcount[i] =
        /* Endian independent */
        (uint8_t)(context->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8));
  }
  c = 0200;
  SHA1_Update(context, &c, 1);
  while ((context->count[0] & 504) != 448) {
    c = 0000;
    SHA1_Update(context, &c, 1);
  }
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1_Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] = (uint8_t)(context->state[i >> 2] >> ((3 - (i & 3)) * 8));
  }
  /* Wipe variables */
  memset(context, '\0', sizeof(*context));
  memset(&finalcount, '\0', sizeof(finalcount));
}